

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.cpp
# Opt level: O2

void __thiscall FFT::ComplexData::set(ComplexData *this,Image *image)

{
  uint uVar1;
  uint32_t uVar2;
  uint uVar3;
  imageException *this_00;
  uchar *puVar4;
  uchar *puVar5;
  kiss_fft_cpx *pkVar6;
  ulong uVar7;
  
  if ((image->_data != (uchar *)0x0) && (image->_colorCount == '\x01')) {
    BaseComplexData<kiss_fft_cpx>::_clean(&this->super_BaseComplexData<kiss_fft_cpx>);
    (*(this->super_BaseComplexData<kiss_fft_cpx>)._vptr_BaseComplexData[2])
              (this,(ulong)(image->_height * image->_width) << 3);
    uVar1 = image->_width;
    (this->super_BaseComplexData<kiss_fft_cpx>)._width = uVar1;
    uVar2 = image->_height;
    (this->super_BaseComplexData<kiss_fft_cpx>)._height = uVar2;
    uVar3 = image->_rowSize;
    puVar5 = image->_data;
    pkVar6 = (this->super_BaseComplexData<kiss_fft_cpx>)._data;
    puVar4 = puVar5 + uVar2 * uVar3;
    for (; puVar5 != puVar4; puVar5 = puVar5 + uVar3) {
      for (uVar7 = 0; uVar1 != uVar7; uVar7 = uVar7 + 1) {
        pkVar6->r = (float)puVar5[uVar7];
        pkVar6->i = 0.0;
        pkVar6 = pkVar6 + 1;
      }
    }
    return;
  }
  this_00 = (imageException *)__cxa_allocate_exception(0x28);
  imageException::imageException
            (this_00,"Failed to allocate complex data for empty or coloured image");
  __cxa_throw(this_00,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void FFTExecutor::directTransform( const ComplexData & in, ComplexData & out )
    {
        if ( _planDirect == 0 || !equalSize( *this, in ) || !equalSize( in, out ) )
            throw imageException( "Invalid parameters for FFTExecutor::directTransform()" );

        kiss_fftnd( _planDirect, in.data(), out.data() );
    }